

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O1

void deqp::gles2::Performance::writeConditionalWorkload
               (ostringstream *stream,char *resultName,char *operandName)

{
  size_t sVar1;
  int iVar2;
  
  if (resultName == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar1 = strlen(resultName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,resultName,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream," = ",3);
  iVar2 = 0x40;
  do {
    if (iVar2 != 0x40) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"*",1);
    }
    if (operandName == (char *)0x0) {
      std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
    }
    else {
      sVar1 = strlen(operandName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,operandName,sVar1);
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,";",1);
  return;
}

Assistant:

static void writeConditionalWorkload (std::ostringstream& stream, const char* resultName, const char* operandName)
{
	const int numMultiplications = 64;

	stream << resultName << " = ";

	for (int i = 0; i < numMultiplications; i++)
	{
		if (i > 0)
			stream << "*";

		stream << operandName;
	}

	stream << ";";
}